

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

__m128i get_recon_8x8(__m128i pred,__m128i res_lo,__m128i res_hi,int fliplr,int bd)

{
  undefined1 in_XMM0 [16];
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int in_XMM1_Da;
  int in_XMM1_Db;
  int in_XMM1_Dc;
  int in_XMM1_Dd;
  int in_XMM2_Da;
  int in_XMM2_Db;
  int in_XMM2_Dc;
  int in_XMM2_Dd;
  __m128i alVar3;
  __m128i u;
  
  auVar1 = pmovzxwd(in_XMM0,in_XMM0);
  if ((int)pred[0] == 0) {
    auVar2._0_4_ = auVar1._0_4_ + in_XMM1_Da;
    auVar2._4_4_ = auVar1._4_4_ + in_XMM1_Db;
    auVar2._8_4_ = auVar1._8_4_ + in_XMM1_Dc;
    auVar2._12_4_ = auVar1._12_4_ + in_XMM1_Dd;
  }
  else {
    auVar2._0_4_ = auVar1._0_4_ + in_XMM2_Dd;
    auVar2._4_4_ = auVar1._4_4_ + in_XMM2_Dc;
    auVar2._8_4_ = auVar1._8_4_ + in_XMM2_Db;
    auVar2._12_4_ = auVar1._12_4_ + in_XMM2_Da;
    in_XMM2_Da = in_XMM1_Dd;
    in_XMM2_Db = in_XMM1_Dc;
    in_XMM2_Dc = in_XMM1_Db;
    in_XMM2_Dd = in_XMM1_Da;
  }
  auVar1._0_4_ = in_XMM2_Da + (uint)in_XMM0._8_2_;
  auVar1._4_4_ = in_XMM2_Db + (uint)in_XMM0._10_2_;
  auVar1._8_4_ = in_XMM2_Dc + (uint)in_XMM0._12_2_;
  auVar1._12_4_ = in_XMM2_Dd + (uint)in_XMM0._14_2_;
  packusdw(auVar2,auVar1);
  u[0] = pred[1] & 0xffffffff;
  u[1] = pred[1];
  alVar3 = highbd_clamp_epi16(u,(int)res_lo[0]);
  alVar3[0] = alVar3[0];
  alVar3[1] = alVar3[1];
  return alVar3;
}

Assistant:

static __m128i get_recon_8x8(const __m128i pred, __m128i res_lo, __m128i res_hi,
                             int fliplr, int bd) {
  __m128i x0, x1;
  const __m128i zero = _mm_setzero_si128();

  x0 = _mm_unpacklo_epi16(pred, zero);
  x1 = _mm_unpackhi_epi16(pred, zero);

  if (fliplr) {
    res_lo = _mm_shuffle_epi32(res_lo, 0x1B);
    res_hi = _mm_shuffle_epi32(res_hi, 0x1B);
    x0 = _mm_add_epi32(res_hi, x0);
    x1 = _mm_add_epi32(res_lo, x1);

  } else {
    x0 = _mm_add_epi32(res_lo, x0);
    x1 = _mm_add_epi32(res_hi, x1);
  }

  x0 = _mm_packus_epi32(x0, x1);
  return highbd_clamp_epi16(x0, bd);
}